

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesDevicePciGetStats(zes_device_handle_t hDevice,zes_pci_stats_t *pStats)

{
  zes_pfnDevicePciGetStats_t pfnPciGetStats;
  ze_result_t result;
  zes_pci_stats_t *pStats_local;
  zes_device_handle_t hDevice_local;
  
  pfnPciGetStats._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c9f8 != (code *)0x0) {
    pfnPciGetStats._4_4_ = (*DAT_0011c9f8)(hDevice,pStats);
  }
  return pfnPciGetStats._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDevicePciGetStats(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        zes_pci_stats_t* pStats                         ///< [in,out] Will contain a snapshot of the latest stats.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnPciGetStats = context.zesDdiTable.Device.pfnPciGetStats;
        if( nullptr != pfnPciGetStats )
        {
            result = pfnPciGetStats( hDevice, pStats );
        }
        else
        {
            // generic implementation
        }

        return result;
    }